

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type
pugi::impl::anon_unknown_0::latin1_decoder::process<pugi::impl::(anonymous_namespace)::utf8_counter>
          (size_t data,value_type size,value_type result)

{
  undefined8 local_28;
  value_type result_local;
  size_t size_local;
  uint8_t *data_local;
  
  local_28 = result;
  size_local = data;
  for (result_local = size; result_local != 0; result_local = result_local - 1) {
    local_28 = utf8_counter::low(local_28,(uint)*(byte *)size_local);
    size_local = size_local + 1;
  }
  return local_28;
}

Assistant:

static inline typename Traits::value_type process(const uint8_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				result = Traits::low(result, *data);
				data += 1;
				size -= 1;
			}

			return result;
		}